

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorOperations.cpp
# Opt level: O0

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::BinaryTranslatorOperator::convertToMessage
          (BinaryTranslatorOperator *this,SmallBuffer *value)

{
  __uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true> in_RDI;
  __single_object *m;
  SmallBuffer *in_stack_ffffffffffffffd0;
  SmallBuffer *in_stack_ffffffffffffffd8;
  
  std::make_unique<helics::Message>();
  CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x32068d);
  SmallBuffer::operator=(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)
         in_RDI.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
         super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
         super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Message> BinaryTranslatorOperator::convertToMessage(const SmallBuffer& value)
{
    auto m = std::make_unique<Message>();
    m->data = value;
    return m;
}